

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
presolve::HighsPostsolveStack::getReducedPrimalSolution
          (HighsPostsolveStack *this,vector<double,_std::allocator<double>_> *origPrimalSolution)

{
  bool bVar1;
  reference ppVar2;
  vector<double,_std::allocator<double>_> *pvVar3;
  reference pvVar4;
  reference pvVar5;
  vector<double,_std::allocator<double>_> *in_RSI;
  DuplicateColumn *in_RDI;
  size_t i;
  size_t reducedNumCol;
  LinearTransform linearTransform;
  DuplicateColumn duplicateColReduction;
  pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long> *primalColTransformation;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
  *__range2;
  vector<double,_std::allocator<double>_> *reducedSolution;
  vector<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
  *in_stack_ffffffffffffff28;
  value_type vVar6;
  undefined7 in_stack_ffffffffffffff30;
  ReductionType in_stack_ffffffffffffff37;
  DuplicateColumn *this_00;
  DuplicateColumn *in_stack_ffffffffffffff50;
  vector<double,_std::allocator<double>_> *this_01;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff78;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff80;
  __normal_iterator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_*,_std::vector<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>_>
  local_30;
  vector<double,_std::allocator<double>_> *local_28;
  undefined1 local_19;
  
  local_19 = 0;
  this_00 = in_RDI;
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  local_28 = in_RSI + 3;
  local_30._M_current =
       (pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long> *)
       std::
       vector<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
       ::begin(in_stack_ffffffffffffff28);
  std::
  vector<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
  ::end(in_stack_ffffffffffffff28);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_*,_std::vector<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>_>
                             *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                            (__normal_iterator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_*,_std::vector<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>_>
                             *)in_stack_ffffffffffffff28), bVar1) {
    ppVar2 = __gnu_cxx::
             __normal_iterator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_*,_std::vector<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>_>
             ::operator*(&local_30);
    in_stack_ffffffffffffff37 = ppVar2->first;
    if (in_stack_ffffffffffffff37 == kLinearTransform) {
      HighsDataStack::setPosition
                ((HighsDataStack *)
                 &in_RSI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,ppVar2->second);
      HighsDataStack::pop<presolve::HighsPostsolveStack::LinearTransform,_0>
                ((HighsDataStack *)this_00,(LinearTransform *)in_RDI);
      LinearTransform::transformToPresolvedSpace
                ((LinearTransform *)this_00,(vector<double,_std::allocator<double>_> *)in_RDI);
    }
    else if (in_stack_ffffffffffffff37 == kDuplicateColumn) {
      HighsDataStack::setPosition
                ((HighsDataStack *)
                 &in_RSI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,ppVar2->second);
      HighsDataStack::pop<presolve::HighsPostsolveStack::DuplicateColumn,_0>
                ((HighsDataStack *)this_00,in_RDI);
      DuplicateColumn::transformToPresolvedSpace(in_stack_ffffffffffffff50,in_RSI);
    }
    __gnu_cxx::
    __normal_iterator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_*,_std::vector<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>_>
    ::operator++(&local_30);
  }
  pvVar3 = (vector<double,_std::allocator<double>_> *)
           std::vector<int,_std::allocator<int>_>::size
                     ((vector<int,_std::allocator<int>_> *)(in_RSI + 4));
  for (this_01 = (vector<double,_std::allocator<double>_> *)0x0; this_01 < pvVar3;
      this_01 = (vector<double,_std::allocator<double>_> *)
                ((long)&(this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start + 1)) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RSI + 4),(size_type)this_01);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)in_RDI,(long)*pvVar4);
    vVar6 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)in_RDI,(size_type)this_01);
    *pvVar5 = vVar6;
  }
  std::vector<double,_std::allocator<double>_>::resize(this_01,(size_type)in_RSI);
  return (vector<double,_std::allocator<double>_> *)this_00;
}

Assistant:

std::vector<double> getReducedPrimalSolution(
      const std::vector<double>& origPrimalSolution) {
    std::vector<double> reducedSolution = origPrimalSolution;

    for (const std::pair<ReductionType, size_t>& primalColTransformation :
         reductions) {
      switch (primalColTransformation.first) {
        case ReductionType::kDuplicateColumn: {
          DuplicateColumn duplicateColReduction;
          reductionValues.setPosition(primalColTransformation.second);
          reductionValues.pop(duplicateColReduction);
          duplicateColReduction.transformToPresolvedSpace(reducedSolution);
          break;
        }
        case ReductionType::kLinearTransform: {
          reductionValues.setPosition(primalColTransformation.second);
          LinearTransform linearTransform;
          reductionValues.pop(linearTransform);
          linearTransform.transformToPresolvedSpace(reducedSolution);
          break;
        }
        default:
          continue;
      }
    }

    size_t reducedNumCol = origColIndex.size();
    for (size_t i = 0; i < reducedNumCol; ++i)
      reducedSolution[i] = reducedSolution[origColIndex[i]];

    reducedSolution.resize(reducedNumCol);
    return reducedSolution;
  }